

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void Id_DsdManTuneStr1(If_DsdMan_t *p,char *pStruct,int nConfls,int fVerbose)

{
  uint *puVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Ifn_Ntk_t *p_00;
  size_t sVar9;
  char *__dest;
  long lVar10;
  Vec_Wrd_t *pVVar11;
  word *pwVar12;
  ProgressBar *p_01;
  long lVar13;
  word extraout_RDX;
  word extraout_RDX_00;
  word extraout_RDX_01;
  word Fill;
  ulong uVar14;
  word *pConfig;
  timespec ts;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p_00 = Ifn_NtkParse(pStruct);
  if (p_00 != (Ifn_Ntk_t *)0x0) {
    iVar3 = p->nVars;
    iVar4 = Ifn_NtkInputNum(p_00);
    if (iVar4 < iVar3) {
      uVar6 = p->nVars;
      uVar5 = Ifn_NtkInputNum(p_00);
      printf("The support of DSD manager (%d) exceeds the support of the structure (%d).\n",
             (ulong)uVar6,(ulong)uVar5);
    }
    else {
      if (p->pCellStr != (char *)0x0) {
        free(p->pCellStr);
        p->pCellStr = (char *)0x0;
      }
      if (pStruct == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar9 = strlen(pStruct);
        __dest = (char *)malloc(sVar9 + 1);
        strcpy(__dest,pStruct);
      }
      p->pCellStr = __dest;
      iVar3 = p->nVars;
      iVar4 = Ifn_NtkInputNum(p_00);
      if (iVar3 < iVar4) {
        uVar6 = p->nVars;
        uVar5 = Ifn_NtkInputNum(p_00);
        printf("Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n"
               ,(ulong)uVar6,(ulong)uVar5);
      }
      uVar6 = Ifn_NtkLutSizeMax(p_00);
      uVar5 = Ifn_NtkTtBits(pStruct);
      p->nTtBits = uVar5;
      p->nConfigWords = (((int)uVar5 >> 6) - (uint)((uVar5 & 0x3f) == 0)) + 2;
      Fill = extraout_RDX;
      if (fVerbose != 0) {
        printf("Considering programmable cell: ");
        Ifn_NtkPrint(p_00);
        printf("Largest LUT size = %d.\n",(ulong)uVar6);
        Fill = extraout_RDX_00;
      }
      if (0 < p->nObjsPrev) {
        printf("Starting the tuning process from object %d (out of %d).\n",(ulong)(uint)p->nObjsPrev
               ,(ulong)(uint)(p->vObjs).nSize);
        Fill = extraout_RDX_01;
      }
      iVar3 = (p->vObjs).nSize;
      if (0 < iVar3) {
        lVar10 = 0;
        do {
          if (p->nObjsPrev <= lVar10) {
            puVar1 = (uint *)((long)(p->vObjs).pArray[lVar10] + 4);
            *puVar1 = *puVar1 & 0xfffffeff;
            iVar3 = (p->vObjs).nSize;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar3);
      }
      lVar10 = (long)iVar3 * (long)p->nConfigWords;
      iVar4 = (int)lVar10;
      if (p->vConfigs == (Vec_Wrd_t *)0x0) {
        pVVar11 = (Vec_Wrd_t *)malloc(0x10);
        iVar8 = 0x10;
        if (0xe < iVar4 - 1U) {
          iVar8 = iVar4;
        }
        pVVar11->nCap = iVar8;
        if (iVar8 == 0) {
          pwVar12 = (word *)0x0;
        }
        else {
          pwVar12 = (word *)malloc((long)iVar8 << 3);
        }
        pVVar11->pArray = pwVar12;
        pVVar11->nSize = iVar4;
        memset(pwVar12,0,lVar10 * 8);
        p->vConfigs = pVVar11;
      }
      else {
        Vec_WrdFillExtra(p->vConfigs,iVar4,Fill);
        iVar3 = (p->vObjs).nSize;
      }
      p_01 = Extra_ProgressBarStart(_stdout,iVar3);
      uVar6 = p->nObjsPrev;
      uVar14 = (ulong)uVar6;
      if ((int)uVar6 < (p->vObjs).nSize) {
        iVar3 = uVar6 * 2;
        do {
          if ((int)uVar6 < 0) {
LAB_004291f7:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar2 = (p->vObjs).pArray[uVar14];
          iVar4 = (int)uVar14;
          if (((char)uVar14 == '\0') &&
             ((p_01 == (ProgressBar *)0x0 || (p_01->nItemsNext <= iVar4)))) {
            Extra_ProgressBarUpdate_int(p_01,iVar4,(char *)0x0);
          }
          uVar5 = *(uint *)((long)pvVar2 + 4) >> 3 & 0x1f;
          pwVar12 = p->pTtElems[0xc];
          If_DsdManComputeTruthPtr(p,iVar3,(uchar *)0x0,pwVar12);
          if (fVerbose != 0) {
            printf("%6d : %2d ",uVar14 & 0xffffffff,(ulong)uVar5);
          }
          uVar7 = p->nConfigWords * iVar4;
          if (((int)uVar7 < 0) || (p->vConfigs->nSize <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          pConfig = p->vConfigs->pArray + uVar7;
          iVar8 = Ifn_NtkMatch(p_00,pwVar12,uVar5,nConfls,fVerbose,0,pConfig);
          if (iVar8 == 0) {
            if ((p->vObjs).nSize <= iVar4) goto LAB_004291f7;
            puVar1 = (uint *)((long)(p->vObjs).pArray[uVar14] + 4);
            *puVar1 = *puVar1 | 0x100;
            memset(pConfig,0,(long)p->nConfigWords << 3);
          }
          uVar14 = uVar14 + 1;
          iVar3 = iVar3 + 2;
        } while ((int)uVar14 < (p->vObjs).nSize);
      }
      p->nObjsPrev = 0;
      p->LutSize = 0;
      Extra_ProgressBarStop(p_01);
      printf("Finished matching %d functions. ",(ulong)(uint)(p->vObjs).nSize);
      iVar4 = 3;
      iVar3 = clock_gettime(3,&local_40);
      if (iVar3 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      Abc_Print(iVar4,"%s =","Time");
      Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar10 + lVar13) / 1000000.0);
    }
    free(p_00);
  }
  return;
}

Assistant:

void Id_DsdManTuneStr1( If_DsdMan_t * p, char * pStruct, int nConfls, int fVerbose )
{
    int fVeryVerbose = 0;
    ProgressBar * pProgress = NULL;
    If_DsdObj_t * pObj;
    word * pTruth, * pConfig;
    int i, nVars, Value, LutSize;
    abctime clk = Abc_Clock();
    // parse the structure
    Ifn_Ntk_t * pNtk = Ifn_NtkParse( pStruct );
    if ( pNtk == NULL )
        return;
    if ( If_DsdManVarNum(p) > Ifn_NtkInputNum(pNtk) )
    {
        printf( "The support of DSD manager (%d) exceeds the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
        ABC_FREE( pNtk );
        return;
    }
    ABC_FREE( p->pCellStr );
    p->pCellStr = Abc_UtilStrsav( pStruct );
    if ( If_DsdManVarNum(p) < Ifn_NtkInputNum(pNtk) )
        printf( "Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
    LutSize = Ifn_NtkLutSizeMax(pNtk);
    p->nTtBits = Ifn_NtkTtBits( pStruct );
    p->nConfigWords = 1 + Abc_Bit6WordNum( p->nTtBits );
    // print
    if ( fVerbose )
    {
        printf( "Considering programmable cell: " );
        Ifn_NtkPrint( pNtk );
        printf( "Largest LUT size = %d.\n", LutSize );
    }
    if ( p->nObjsPrev > 0 )
        printf( "Starting the tuning process from object %d (out of %d).\n", p->nObjsPrev, Vec_PtrSize(&p->vObjs) );
    // clean the attributes
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        if ( i >= p->nObjsPrev )
            pObj->fMark = 0;
    if ( p->vConfigs == NULL )
        p->vConfigs = Vec_WrdStart( p->nConfigWords * Vec_PtrSize(&p->vObjs) );
    else
        Vec_WrdFillExtra( p->vConfigs, p->nConfigWords * Vec_PtrSize(&p->vObjs), 0 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(&p->vObjs) );
    If_DsdVecForEachObjStart( &p->vObjs, pObj, i, p->nObjsPrev )
    {
        if ( (i & 0xFF) == 0 )
            Extra_ProgressBarUpdate( pProgress, i, NULL );
        nVars = If_DsdObjSuppSize(pObj);
        //if ( nVars <= LutSize )
        //    continue;
        pTruth = If_DsdManComputeTruth( p, Abc_Var2Lit(i, 0), NULL );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( pTruth, nVars );
        if ( fVerbose )
            printf( "%6d : %2d ", i, nVars );
        pConfig = Vec_WrdEntryP( p->vConfigs, p->nConfigWords * i );
        Value = Ifn_NtkMatch( pNtk, pTruth, nVars, nConfls, fVerbose, fVeryVerbose, pConfig );
        if ( fVeryVerbose )
            printf( "\n" );
        if ( Value == 0 )
        {
            If_DsdVecObjSetMark( &p->vObjs, i );
            memset( pConfig, 0, sizeof(word) * p->nConfigWords );
        }
    }
    p->nObjsPrev = 0;
    p->LutSize = 0;
    Extra_ProgressBarStop( pProgress );
    printf( "Finished matching %d functions. ", Vec_PtrSize(&p->vObjs) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVeryVerbose )
        If_DsdManPrintDistrib( p );
    ABC_FREE( pNtk );
}